

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O2

int BIO_free(BIO *a)

{
  BIO *pBVar1;
  _func_601 *p_Var2;
  int iVar3;
  
  while( true ) {
    if (a == (BIO *)0x0) {
      return 1;
    }
    iVar3 = CRYPTO_refcount_dec_and_test_zero((CRYPTO_refcount_t *)&a->retry_reason);
    if (iVar3 == 0) break;
    pBVar1 = (BIO *)a->ptr;
    a->ptr = (void *)0x0;
    if ((a->method != (BIO_METHOD *)0x0) &&
       (p_Var2 = a->method->destroy, p_Var2 != (_func_601 *)0x0)) {
      (*p_Var2)(a);
    }
    CRYPTO_free_ex_data(0x5cb8a0,a,(CRYPTO_EX_DATA *)&a->callback);
    OPENSSL_free(a);
    a = pBVar1;
  }
  return 0;
}

Assistant:

int BIO_free(BIO *bio) {
  BIO *next_bio;

  for (; bio != NULL; bio = next_bio) {
    if (!CRYPTO_refcount_dec_and_test_zero(&bio->references)) {
      return 0;
    }

    next_bio = BIO_pop(bio);

    if (bio->method != NULL && bio->method->destroy != NULL) {
      bio->method->destroy(bio);
    }

    CRYPTO_free_ex_data(&g_ex_data_class, bio, &bio->ex_data);
    OPENSSL_free(bio);
  }
  return 1;
}